

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

void testLutHeader(void)

{
  undefined1 auVar1 [16];
  byte bVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  reference ppRVar6;
  size_type sVar7;
  size_type sVar8;
  reference ppLVar9;
  size_t sVar10;
  size_t *psVar11;
  size_t sVar12;
  size_t i_6;
  size_t element;
  size_t i_5;
  int elementIdx;
  size_t value;
  size_t i_4;
  int offsetPrev;
  int offsetIdx;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
  runners;
  size_t i;
  size_t workerInterval;
  size_t numWorkers;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  workers;
  value_type *in_stack_fffffffffffffe78;
  value_type pLVar13;
  vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
  *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  LutHeaderWorker *in_stack_fffffffffffffe90;
  LutHeaderWorker *in_stack_fffffffffffffe98;
  ulong uVar14;
  Runner *in_stack_fffffffffffffea0;
  LutHeaderWorker *in_stack_ffffffffffffff00;
  size_type local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_a4;
  ulong local_a0;
  ulong local_98;
  int local_90;
  int local_8c;
  size_type local_88;
  ulong local_80;
  ulong local_70;
  vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
  local_68;
  void *local_50;
  void *local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_20;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  local_18;
  
  std::
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ::vector((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
            *)0x123f04);
  iVar3 = cpuCount();
  local_20 = (ulong)iVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_20;
  local_38 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) / auVar1,0);
  for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
    if (local_40 == local_20 - 1) {
      pvVar5 = operator_new(0x30);
      anon_unknown.dwarf_22511::LutHeaderWorker::LutHeaderWorker
                (in_stack_fffffffffffffe90,
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (size_t)in_stack_fffffffffffffe80);
      local_50 = pvVar5;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
    }
    else {
      pvVar5 = operator_new(0x30);
      anon_unknown.dwarf_22511::LutHeaderWorker::LutHeaderWorker
                (in_stack_fffffffffffffe90,
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (size_t)in_stack_fffffffffffffe80);
      local_48 = pvVar5;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
    }
  }
  bVar2 = IlmThread_3_4::supportsThreads();
  if ((bVar2 & 1) == 0) {
    local_88 = 0;
    while (sVar8 = local_88,
          sVar7 = std::
                  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                  ::size(&local_18), sVar8 < sVar7) {
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::operator[](&local_18,local_88);
      anon_unknown.dwarf_22511::LutHeaderWorker::run
                (in_stack_ffffffffffffff00,SUB81(sVar8 >> 0x38,0));
      local_88 = local_88 + 1;
    }
  }
  else {
    std::
    vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ::vector((vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
              *)0x124102);
    for (local_70 = 0;
        sVar8 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::size(&local_18), local_70 < sVar8; local_70 = local_70 + 1) {
      operator_new(0x48);
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::operator[](&local_18,local_70);
      anon_unknown.dwarf_22511::LutHeaderWorker::Runner::Runner
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
      std::
      vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
      ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    for (local_80 = 0;
        sVar8 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::size(&local_18), local_80 < sVar8; local_80 = local_80 + 1) {
      ppRVar6 = std::
                vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
                ::operator[](&local_68,local_80);
      if (*ppRVar6 != (value_type)0x0) {
        (**(code **)(*(long *)*ppRVar6 + 8))();
      }
    }
    std::
    vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ::~vector((vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
               *)in_stack_fffffffffffffe90);
  }
  printf("test closestDataOffset[]\n");
  local_8c = 0;
  local_90 = 0;
  for (local_98 = 0;
      sVar8 = std::
              vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ::size(&local_18), local_98 < sVar8; local_98 = local_98 + 1) {
    local_a0 = 0;
    while( true ) {
      ppLVar9 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::operator[](&local_18,local_98);
      sVar10 = anon_unknown.dwarf_22511::LutHeaderWorker::numValues(*ppLVar9);
      if (sVar10 <= local_a0) break;
      uVar4 = *(uint *)(internal_test_ns::closestDataOffset + (long)local_8c * 4);
      ppLVar9 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::operator[](&local_18,local_98);
      psVar11 = anon_unknown.dwarf_22511::LutHeaderWorker::offset(*ppLVar9);
      if ((ulong)uVar4 != psVar11[local_a0] + (long)local_90) {
        core_test_fail((char *)in_stack_fffffffffffffe90,
                       (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                       (char *)in_stack_fffffffffffffe78);
      }
      local_8c = local_8c + 1;
      local_a0 = local_a0 + 1;
    }
    ppLVar9 = std::
              vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ::operator[](&local_18,local_98);
    psVar11 = anon_unknown.dwarf_22511::LutHeaderWorker::offset(*ppLVar9);
    ppLVar9 = std::
              vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ::operator[](&local_18,local_98);
    sVar10 = anon_unknown.dwarf_22511::LutHeaderWorker::numValues(*ppLVar9);
    sVar10 = psVar11[sVar10 - 1];
    ppLVar9 = std::
              vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ::operator[](&local_18,local_98);
    sVar12 = anon_unknown.dwarf_22511::LutHeaderWorker::lastCandidateCount(*ppLVar9);
    local_90 = local_90 + (int)sVar10 + (int)sVar12;
  }
  printf("test closestData[]\n");
  local_a4 = 0;
  for (local_b0 = 0;
      sVar8 = std::
              vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ::size(&local_18), local_b0 < sVar8; local_b0 = local_b0 + 1) {
    local_b8 = 0;
    while( true ) {
      uVar14 = local_b8;
      ppLVar9 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::operator[](&local_18,local_b0);
      sVar10 = anon_unknown.dwarf_22511::LutHeaderWorker::numElements(*ppLVar9);
      if (sVar10 <= uVar14) break;
      uVar4 = (uint)*(ushort *)(&internal_test_ns::closestData + (long)local_a4 * 2);
      ppLVar9 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::operator[](&local_18,local_b0);
      in_stack_fffffffffffffe90 =
           (LutHeaderWorker *)anon_unknown.dwarf_22511::LutHeaderWorker::elements(*ppLVar9);
      if (uVar4 != *(ushort *)((long)&in_stack_fffffffffffffe90->_lastCandidateCount + local_b8 * 2)
         ) {
        core_test_fail((char *)in_stack_fffffffffffffe90,
                       (char *)CONCAT44(uVar4,in_stack_fffffffffffffe88),
                       (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                       (char *)in_stack_fffffffffffffe78);
      }
      local_a4 = local_a4 + 1;
      local_b8 = local_b8 + 1;
    }
  }
  local_c0 = 0;
  while (sVar8 = local_c0,
        sVar7 = std::
                vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                ::size(&local_18), sVar8 < sVar7) {
    ppLVar9 = std::
              vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ::operator[](&local_18,local_c0);
    pLVar13 = *ppLVar9;
    if (pLVar13 != (value_type)0x0) {
      anon_unknown.dwarf_22511::LutHeaderWorker::~LutHeaderWorker(in_stack_fffffffffffffe90);
      operator_delete(pLVar13,0x30);
    }
    local_c0 = local_c0 + 1;
  }
  std::
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ::~vector((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
             *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

static void
testLutHeader ()
{
    std::vector<LutHeaderWorker*> workers;

    size_t numWorkers     = cpuCount ();
    size_t workerInterval = 65536 / numWorkers;

    for (size_t i = 0; i < numWorkers; ++i)
    {
        if (i != numWorkers - 1)
        {
            workers.push_back (new LutHeaderWorker (
                i * workerInterval, (i + 1) * workerInterval));
        }
        else
        {
            workers.push_back (new LutHeaderWorker (i * workerInterval, 65536));
        }
    }

    if (ILMTHREAD_NAMESPACE::supportsThreads ())
    {
        std::vector<LutHeaderWorker::Runner*> runners;
        for (size_t i = 0; i < workers.size (); ++i)
        {
            runners.push_back (
                new LutHeaderWorker::Runner (*workers[i], (i == 0)));
        }

        for (size_t i = 0; i < workers.size (); ++i)
        {
            delete runners[i];
        }
    }
    else
    {
        for (size_t i = 0; i < workers.size (); ++i)
        {
            workers[i]->run (i == 0);
        }
    }

    printf ("test closestDataOffset[]\n");
    int offsetIdx  = 0;
    int offsetPrev = 0;
    for (size_t i = 0; i < workers.size (); ++i)
    {
        for (size_t value = 0; value < workers[i]->numValues (); ++value)
        {
            EXRCORE_TEST (
                internal_test_ns::closestDataOffset[offsetIdx] ==
                workers[i]->offset ()[value] + offsetPrev);
            offsetIdx++;
        }
        offsetPrev += workers[i]->offset ()[workers[i]->numValues () - 1] +
                      workers[i]->lastCandidateCount ();
    }

    printf ("test closestData[]\n");
    int elementIdx = 0;
    for (size_t i = 0; i < workers.size (); ++i)
    {
        for (size_t element = 0; element < workers[i]->numElements ();
             ++element)
        {
            EXRCORE_TEST (
                internal_test_ns::closestData[elementIdx] ==
                workers[i]->elements ()[element]);
            elementIdx++;
        }
    }

    for (size_t i = 0; i < workers.size (); ++i)
    {
        delete workers[i];
    }
}